

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O0

void __thiscall CProfileNode::CleanupMemory(CProfileNode *this)

{
  void *pvVar1;
  long in_RDI;
  
  pvVar1 = *(void **)(in_RDI + 0x28);
  if (pvVar1 != (void *)0x0) {
    ~CProfileNode((CProfileNode *)0x1566cc);
    ::operator_delete(pvVar1);
  }
  *(undefined8 *)(in_RDI + 0x28) = 0;
  pvVar1 = *(void **)(in_RDI + 0x30);
  if (pvVar1 != (void *)0x0) {
    ~CProfileNode((CProfileNode *)0x1566fc);
    ::operator_delete(pvVar1);
  }
  *(undefined8 *)(in_RDI + 0x30) = 0;
  return;
}

Assistant:

void	CProfileNode::CleanupMemory()
{
	delete ( Child);
	Child = NULL;
	delete ( Sibling);
	Sibling = NULL;
}